

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

bool __thiscall
pegmatite::ASTContainer::construct(ASTContainer *this,InputRange *r,ASTStack *st,ErrorReporter *err)

{
  ASTMember *pAVar1;
  pointer ppAVar2;
  __normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>
  __tmp;
  pointer ppAVar3;
  
  ppAVar2 = (this->members).
            super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar3 = (this->members).
            super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar2) {
    do {
      pAVar1 = ppAVar3[-1];
      ppAVar3 = ppAVar3 + -1;
      (*(code *)**(undefined8 **)((long)&pAVar1->field_0x0 + *(long *)(*(long *)pAVar1 + -0x28)))
                ((long)&pAVar1->field_0x0 + *(long *)(*(long *)pAVar1 + -0x28),r,st,err);
      ppAVar2 = (this->members).
                super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (ppAVar3 != ppAVar2);
    ppAVar3 = (this->members).
              super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppAVar3 != ppAVar2) {
    (this->members).
    super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar2;
  }
  return true;
}

Assistant:

bool ASTContainer::construct(const InputRange &r, ASTStack &st,
                             const ErrorReporter &err)
{
	bool success = true;

	for(auto it = members.rbegin(); it != members.rend(); ++it)
	{
		ASTMember *member = *it;
		success |= member->construct(r, st, err);
	}
	// We don't need the members vector anymore, so clean up the storage it
	// uses.
	members.clear();
	return success;
}